

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

_Bool roaring64_bitmap_contains(roaring64_bitmap_t *r,uint64_t val)

{
  _Bool _Var1;
  undefined8 in_RAX;
  art_val_t *paVar2;
  uint8_t high48 [6];
  uint local_18;
  ushort local_14;
  undefined2 uStack_12;
  
  uStack_12 = (undefined2)((ulong)in_RAX >> 0x30);
  _local_18 = CONCAT24((ushort)(val >> 0x18) & 0xff | (ushort)(val >> 8) & 0xff00,
                       (uint)(byte)(val >> 0x38) | ((uint)(val >> 0x20) & 0xff0000) >> 8 |
                       (uint)(val >> 0x18) & 0xff0000 | (uint)(val >> 8) & 0xff000000);
  paVar2 = art_find(&r->art,(art_key_chunk_t *)&local_18);
  if (paVar2 == (art_val_t *)0x0) {
    _Var1 = false;
  }
  else {
    _Var1 = container_contains(r->containers[*paVar2 >> 8],(uint16_t)val,(uint8_t)*paVar2);
  }
  return _Var1;
}

Assistant:

bool roaring64_bitmap_contains(const roaring64_bitmap_t *r, uint64_t val) {
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);
    leaf_t *leaf = (leaf_t *)art_find(&r->art, high48);
    if (leaf != NULL) {
        return container_contains(get_container(r, *leaf), low16,
                                  get_typecode(*leaf));
    }
    return false;
}